

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateCacheVkImpl.cpp
# Opt level: O0

void __thiscall
Diligent::PipelineStateCacheVkImpl::GetData(PipelineStateCacheVkImpl *this,IDataBlob **ppBlob)

{
  PFN_vkGetPipelineCacheData p_Var1;
  VkResult VVar2;
  Char *Message;
  VulkanLogicalDevice *this_00;
  VkDevice pVVar3;
  VkPipelineCache_T *pVVar4;
  DataBlobImpl *pDVar5;
  void *pvVar6;
  undefined1 local_60 [8];
  RefCntAutoPtr<Diligent::DataBlobImpl> pDataBlob;
  size_t DataSize;
  VkDevice vkDevice;
  undefined1 local_38 [8];
  string msg;
  IDataBlob **ppBlob_local;
  PipelineStateCacheVkImpl *this_local;
  
  msg.field_2._8_8_ = ppBlob;
  if (ppBlob == (IDataBlob **)0x0) {
    FormatString<char[24]>((string *)local_38,(char (*) [24])"ppBlob must not be null");
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"GetData",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineStateCacheVkImpl.cpp"
               ,0x55);
    std::__cxx11::string::~string((string *)local_38);
  }
  *(undefined8 *)msg.field_2._8_8_ = 0;
  this_00 = RenderDeviceVkImpl::GetLogicalDevice
                      ((this->super_PipelineStateCacheBase<Diligent::EngineVkImplTraits>).
                       super_DeviceObjectBase<Diligent::IPipelineStateCacheVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateCacheDesc>
                       .m_pDevice);
  pVVar3 = VulkanUtilities::VulkanLogicalDevice::GetVkDevice(this_00);
  p_Var1 = vkGetPipelineCacheData;
  pDataBlob.m_pObject = (DataBlobImpl *)0x0;
  pVVar4 = VulkanUtilities::VulkanObjectWrapper::operator_cast_to_VkPipelineCache_T_
                     ((VulkanObjectWrapper *)&this->m_PipelineStateCache);
  VVar2 = (*p_Var1)(pVVar3,pVVar4,(size_t *)&pDataBlob,(void *)0x0);
  if (VVar2 == VK_SUCCESS) {
    DataBlobImpl::Create((DataBlobImpl *)local_60,(size_t)pDataBlob.m_pObject,(void *)0x0);
    p_Var1 = vkGetPipelineCacheData;
    pVVar4 = VulkanUtilities::VulkanObjectWrapper::operator_cast_to_VkPipelineCache_T_
                       ((VulkanObjectWrapper *)&this->m_PipelineStateCache);
    pDVar5 = RefCntAutoPtr<Diligent::DataBlobImpl>::operator->
                       ((RefCntAutoPtr<Diligent::DataBlobImpl> *)local_60);
    pvVar6 = DataBlobImpl::GetDataPtr(pDVar5,0);
    VVar2 = (*p_Var1)(pVVar3,pVVar4,(size_t *)&pDataBlob,pvVar6);
    if (VVar2 == VK_SUCCESS) {
      pDVar5 = RefCntAutoPtr<Diligent::DataBlobImpl>::Detach
                         ((RefCntAutoPtr<Diligent::DataBlobImpl> *)local_60);
      *(DataBlobImpl **)msg.field_2._8_8_ = pDVar5;
    }
    RefCntAutoPtr<Diligent::DataBlobImpl>::~RefCntAutoPtr
              ((RefCntAutoPtr<Diligent::DataBlobImpl> *)local_60);
  }
  return;
}

Assistant:

void PipelineStateCacheVkImpl::GetData(IDataBlob** ppBlob)
{
    DEV_CHECK_ERR(ppBlob != nullptr, "ppBlob must not be null");
    *ppBlob = nullptr;

    const auto vkDevice = m_pDevice->GetLogicalDevice().GetVkDevice();

    size_t DataSize = 0;
    if (vkGetPipelineCacheData(vkDevice, m_PipelineStateCache, &DataSize, nullptr) != VK_SUCCESS)
        return;

    auto pDataBlob = DataBlobImpl::Create(DataSize);

    if (vkGetPipelineCacheData(vkDevice, m_PipelineStateCache, &DataSize, pDataBlob->GetDataPtr()) != VK_SUCCESS)
        return;

    *ppBlob = pDataBlob.Detach();
}